

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O0

bool_t priIsPrimeW(word a,void *stack)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  word in_RSI;
  ulong in_RDI;
  dword prod;
  word base;
  size_t i;
  size_t iter;
  size_t s;
  word r;
  word *bases;
  bool local_59;
  ulong local_48;
  ulong local_40;
  long local_38;
  ulong local_30;
  ulong local_28;
  word *stack_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar4;
  
  if ((in_RDI < 4) || ((in_RDI & 1) == 0)) {
    local_59 = in_RDI == 2 || in_RDI == 3;
    uVar4 = (uint)local_59;
  }
  else {
    local_30 = 0;
    for (local_28 = in_RDI - 1; (local_28 & 1) == 0; local_28 = local_28 >> 1) {
      local_30 = local_30 + 1;
    }
    if (in_RDI < 0x14f5d5) {
      stack_00 = _bases16;
      local_38 = 2;
    }
    else if (in_RDI < 0x11baa74c5) {
      stack_00 = _bases32;
      local_38 = 3;
    }
    else {
      stack_00 = _bases64;
      local_38 = 7;
    }
    do {
      do {
        lVar3 = local_38 + -1;
        if (local_38 == 0) {
          return 1;
        }
        local_48 = zzPowerModW(CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                               in_RSI,stack_00);
        local_38 = lVar3;
      } while ((local_48 == 1) || (local_48 == in_RDI - 1));
      local_40 = 1;
      while ((local_40 < local_30 &&
             (auVar1._8_8_ = 0, auVar1._0_8_ = local_48, auVar2._8_8_ = 0, auVar2._0_8_ = local_48,
             local_48 = __umodti3(SUB168(auVar1 * auVar2,0),SUB168(auVar1 * auVar2,8),in_RDI,0),
             local_48 != in_RDI - 1))) {
        if (local_48 == 1) {
          return 0;
        }
        local_40 = local_40 + 1;
      }
    } while (local_40 != local_30);
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

bool_t priIsPrimeW(register word a, void* stack)
{
	const word* bases;
	register word r;
	register size_t s;
	register size_t iter;
	register size_t i;
	register word base;
	register dword prod;
	// маленькое или четное?
	if (a <= 3 || a % 2 == 0)
		return a == 2 || a == 3;
	// a - 1 = 2^s r (r -- нечетное)
	for (r = a - 1, s = 0; r % 2 == 0; r >>= 1, ++s);
	ASSERT(s > 0 && WORD_BIT_POS(s) * r + 1 == a);
	// выбираем базис
#if (B_PER_W == 16)
	bases = _bases16, iter = COUNT_OF(_bases16);
#elif (B_PER_W == 32)
	if (a < 1373653)
		bases = _bases16, iter = COUNT_OF(_bases16);
	else
		bases = _bases32, iter = COUNT_OF(_bases32);
#elif (B_PER_W == 64)
	if (a < 1373653)
		bases = _bases16, iter = COUNT_OF(_bases16);
	else if (a < 4759123141)
		bases = _bases32, iter = COUNT_OF(_bases32);
	else
		bases = _bases64, iter = COUNT_OF(_bases64);
#endif
	// итерации
	while (iter--)
	{
		// _bases[iter]^r \equiv \pm 1 \mod a?
		base = zzPowerModW(bases[iter], r, a, stack);
		if (base == 1 || base == a - 1)
			continue;
		// base^{2^i} \equiv - 1\mod a?
		for (i = 1; i < s; ++i)
		{
			prod = base;
			prod *= base, base = prod % a;
			if (base == a - 1)
				break;
			if (base == 1)
			{
				r = base = 0, s = iter = i = 0, prod = 0;
				return FALSE;
			}
		}
		if (i == s)
		{
			r = base = 0, s = iter = i = 0, prod = 0;
			return FALSE;
		}
	}
	r = base = 0, s = iter = i = 0, prod = 0;
	return TRUE;
}